

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.c
# Opt level: O3

void clearAllBuffers(void)

{
  TA_Real *pTVar1;
  TA_Real (*paaTVar2) [4] [480];
  long lVar3;
  TA_Real (*paTVar4) [480];
  long lVar5;
  long lVar6;
  
  paaTVar2 = buf;
  lVar3 = 0;
  do {
    lVar5 = 0;
    paTVar4 = *paaTVar2;
    do {
      lVar6 = 0;
      do {
        pTVar1 = *(TA_Real (*) [480])*paTVar4 + lVar6;
        *pTVar1 = 9.1349043e-200;
        pTVar1[1] = 9.1349043e-200;
        lVar6 = lVar6 + 2;
      } while (lVar6 != 100);
      lVar6 = 100;
      do {
        pTVar1 = *(TA_Real (*) [480])*paTVar4 + lVar6;
        *pTVar1 = 8.1489031e-158;
        pTVar1[1] = 8.1489031e-158;
        lVar6 = lVar6 + 2;
      } while (lVar6 != 0x1e0);
      lVar5 = lVar5 + 1;
      paTVar4 = paTVar4 + 1;
    } while (lVar5 != 4);
    lVar3 = lVar3 + 1;
    paaTVar2 = (TA_Real (*) [4] [480])((long)paaTVar2 + 0x3c00);
  } while (lVar3 != 5);
  return;
}

Assistant:

void clearAllBuffers( void )
{
   unsigned int i,j,k;

   for( i=0; i < NB_GLOBAL_BUFFER; i++ )
   {
      for( j=0; j < TA_NB_OUT_IN; j++ )
      {
         for( k=0; k < TA_BUF_PREFIX; k++ )
            buf[i][j][k] = RESV_PATTERN_PREFIX;
         for( ; k < TA_BUF_SIZE; k++ )
            buf[i][j][k] = RESV_PATTERN_SUFFIX;
      }
   }
}